

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Inquire(int g_a,int *type,int *ndim,int *dims)

{
  long in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  int in_EDI;
  int i;
  Integer _ga_dims [7];
  Integer nndim;
  Integer ttype;
  Integer a;
  Integer *in_stack_00000188;
  Integer *in_stack_00000190;
  Integer *in_stack_00000198;
  Integer in_stack_000001a0;
  int local_7c;
  undefined8 local_78 [8];
  long local_38;
  undefined4 local_30;
  long local_28;
  long local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  
  local_28 = (long)in_EDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pnga_inquire(in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188);
  for (local_7c = 0; local_7c < local_38; local_7c = local_7c + 1) {
    *(int *)(local_20 + ((local_38 - local_7c) + -1) * 4) = (int)local_78[local_7c];
  }
  *local_18 = (int)local_38;
  *local_10 = local_30;
  return;
}

Assistant:

void NGA_Inquire(int g_a, int *type, int *ndim, int dims[])
{
     Integer a=(Integer)g_a;
     Integer ttype, nndim;
     Integer _ga_dims[MAXDIM];
     wnga_inquire(a,&ttype, &nndim, _ga_dims);
     COPYF2C(_ga_dims, dims,nndim);  
     *ndim = (int)nndim;
     *type = (int)ttype;
}